

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_PrintTestIgnored_Test::testBody
          (TEST_TeamCityOutputTest_PrintTestIgnored_Test *this)

{
  TestResult *pTVar1;
  IgnoredUtestShell *this_00;
  UtestShell *pUVar2;
  SimpleString *this_01;
  char *pcVar3;
  TestTerminator *pTVar4;
  IgnoredUtestShell *itst;
  char *expected;
  TEST_TeamCityOutputTest_PrintTestIgnored_Test *this_local;
  
  this_00 = (IgnoredUtestShell *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x7f);
  IgnoredUtestShell::IgnoredUtestShell(this_00,"group","test","file",10);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[6])(pTVar1,this_00);
  millisTime = 0x29;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[7])(pTVar1,this_00);
  pUVar2 = UtestShell::getCurrent();
  this_01 = TeamCityOutputToBuffer::getOutput
                      ((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock);
  pcVar3 = SimpleString::asCharString(this_01);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testStarted name=\'test\']\n##teamcity[testIgnored name=\'test\']\n##teamcity[testFinished name=\'test\' duration=\'41\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,0x83,pTVar4);
  if (this_00 != (IgnoredUtestShell *)0x0) {
    (*(this_00->super_UtestShell)._vptr_UtestShell[1])();
  }
  return;
}

Assistant:

TEST(TeamCityOutputTest, PrintTestIgnored)
{
    const char* expected =
        "##teamcity[testStarted name='test']\n"
        "##teamcity[testIgnored name='test']\n"
        "##teamcity[testFinished name='test' duration='41']\n";

    IgnoredUtestShell* itst = new IgnoredUtestShell("group", "test", "file", 10);
    result->currentTestStarted(itst);
    millisTime = 41;
    result->currentTestEnded(itst);
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
    delete itst;
}